

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.h
# Opt level: O0

bool __thiscall JSONNode::empty(JSONNode *this)

{
  internalJSONNode *piVar1;
  bool bVar2;
  allocator local_31;
  json_string local_30;
  JSONNode *local_10;
  JSONNode *this_local;
  
  piVar1 = this->internal;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"no internal",&local_31);
  JSONDebug::_JSON_ASSERT(piVar1 != (internalJSONNode *)0x0,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  bVar2 = internalJSONNode::empty(this->internal);
  return bVar2;
}

Assistant:

inline bool JSONNode::empty(void) const json_nothrow {
    JSON_CHECK_INTERNAL();
    return internal -> empty();
}